

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkAbcDsd.c
# Opt level: O2

Lpk_Fun_t * Lpk_DsdSplit(Lpk_Man_t *pMan,Lpk_Fun_t *p,char *pCofVars,int nCofVars,uint uBoundSet)

{
  byte bVar1;
  int i;
  uint uVar2;
  int iVar3;
  Kit_DsdNtk_t *pNtk;
  Lpk_Fun_t *p_00;
  ulong uVar4;
  uint *(*papuVar5) [16];
  undefined1 *pIn;
  ulong uVar6;
  long lVar7;
  Lpk_Man_t *pLVar8;
  uint *(*papuVar9) [16];
  uint *puVar10;
  bool bVar11;
  uint local_64;
  
  pIn = &p->field_0xe4;
  Kit_TruthCopy(pMan->ppTruths[0][0],(uint *)pIn,*(uint *)&p->field_0x8 >> 7 & 0x1f);
  for (uVar2 = 0;
      (local_64 = 0xffffffff, uVar2 != 0x20 &&
      (local_64 = uVar2, (uBoundSet >> (uVar2 & 0x1f) & 1) == 0)); uVar2 = uVar2 + 1) {
  }
  uVar4 = 0;
  if (0 < nCofVars) {
    uVar4 = (ulong)(uint)nCofVars;
  }
  uVar6 = 0;
  pLVar8 = pMan;
  while (uVar6 != uVar4) {
    bVar1 = (byte)uVar6 & 0x1f;
    uVar2 = 1 << bVar1;
    if (1 << bVar1 < 1) {
      uVar2 = 0;
    }
    for (lVar7 = 0; (ulong)uVar2 * 8 != lVar7; lVar7 = lVar7 + 8) {
      Kit_TruthCofactor0New
                (*(uint **)((long)pLVar8->ppTruths[1] + lVar7 * 2),
                 *(uint **)((long)pLVar8->ppTruths[0] + lVar7),*(uint *)&p->field_0x8 >> 7 & 0x1f,
                 (int)pCofVars[uVar6]);
      Kit_TruthCofactor1New
                (*(uint **)((long)pLVar8->ppTruths[1] + lVar7 * 2 + 8),
                 *(uint **)((long)pLVar8->ppTruths[0] + lVar7),*(uint *)&p->field_0x8 >> 7 & 0x1f,
                 (int)pCofVars[uVar6]);
    }
    pLVar8 = (Lpk_Man_t *)(pLVar8->pCuts[0].pLeaves + 0x11);
    uVar6 = uVar6 + 1;
  }
  uVar2 = 1 << ((byte)nCofVars & 0x1f);
  uVar4 = 0;
  if (0 < (int)uVar2) {
    uVar4 = (ulong)uVar2;
  }
  papuVar9 = pMan->ppTruths + nCofVars;
  papuVar5 = pMan->ppTruths + (nCofVars + 1);
  while (bVar11 = uVar4 != 0, uVar4 = uVar4 - 1, bVar11) {
    pNtk = Kit_DsdDecomposeExpand((*papuVar9)[0],*(uint *)&p->field_0x8 >> 7 & 0x1f);
    Kit_DsdTruthPartialTwo
              (pMan->pDsdMan,pNtk,uBoundSet,local_64,(*papuVar5)[0],(*papuVar5)[(int)uVar2]);
    Kit_DsdNtkFree(pNtk);
    papuVar9 = (uint *(*) [16])(*papuVar9 + 1);
    papuVar5 = (uint *(*) [16])(*papuVar5 + 1);
  }
  uVar4 = (ulong)(uint)nCofVars;
  puVar10 = pMan->pCuts[0].uSign + uVar4 * 0x20 + -0xb;
  for (; 0 < (int)uVar4; uVar4 = uVar4 - 1) {
    bVar1 = (byte)uVar4 & 0x1f;
    uVar2 = 1 << bVar1;
    if (1 << bVar1 < 1) {
      uVar2 = 0;
    }
    for (lVar7 = 0; (ulong)uVar2 * 8 != lVar7; lVar7 = lVar7 + 8) {
      Kit_TruthMuxVar(*(uint **)("nFans >= 0 && nFans <= 8" + (long)puVar10 + lVar7 + 0x15),
                      *(uint **)(
                                "sat_solver *Ifn_ManStrFindSolver(Gia_Man_t *, Vec_Int_t **, Vec_Int_t **)"
                                + (long)puVar10 + lVar7 * 2 + 0x1a),
                      *(uint **)(
                                "sat_solver *Ifn_ManStrFindSolver(Gia_Man_t *, Vec_Int_t **, Vec_Int_t **)"
                                + (long)puVar10 + lVar7 * 2 + 0x22),
                      *(uint *)&p->field_0x8 >> 7 & 0x1f,(int)pCofVars[uVar4 - 1]);
    }
    puVar10 = puVar10 + -0x20;
  }
  p_00 = Lpk_FunDup(p,pMan->ppTruths[1][1]);
  Kit_TruthCopy((uint *)pIn,pMan->ppTruths[1][0],*(uint *)&p->field_0x8 >> 7 & 0x1f);
  uVar2 = Kit_TruthSupport((uint *)pIn,*(uint *)&p->field_0x8 >> 7 & 0x1f);
  p->uSupp = uVar2;
  lVar7 = (long)(int)local_64;
  p->pFanins[lVar7] = p_00->field_0x8 & 0x7f;
  iVar3 = Lpk_SuppDelay(p_00->uSupp,p_00->pDelays);
  p->pDelays[lVar7] = iVar3;
  p->field_0xb = p->field_0xb & 0xbf;
  Lpk_FunSuppMinimize(p);
  Lpk_FunSuppMinimize(p_00);
  p_00->nDelayLim = p->pDelays[lVar7];
  *(uint *)&p_00->field_0x8 = *(uint *)&p_00->field_0x8 & 0xc000ffff | 0x10000;
  *(uint *)&p->field_0x8 =
       *(uint *)&p->field_0x8 & 0xc000ffff | *(uint *)&p->field_0x8 + 0x3fff0000 & 0x3fff0000;
  return p_00;
}

Assistant:

Lpk_Fun_t * Lpk_DsdSplit( Lpk_Man_t * pMan, Lpk_Fun_t * p, char * pCofVars, int nCofVars, unsigned uBoundSet )
{
    Lpk_Fun_t * pNew;
    Kit_DsdNtk_t * pNtkDec;
    int i, k, iVacVar, nCofs;
    // prepare storage
    Kit_TruthCopy( pMan->ppTruths[0][0], Lpk_FunTruth(p, 0), p->nVars );
    // get the vacuous variable
    iVacVar = Kit_WordFindFirstBit( uBoundSet );
    // compute the cofactors
    for ( i = 0; i < nCofVars; i++ )
        for ( k = 0; k < (1<<i); k++ )
        {
            Kit_TruthCofactor0New( pMan->ppTruths[i+1][2*k+0], pMan->ppTruths[i][k], p->nVars, pCofVars[i] );
            Kit_TruthCofactor1New( pMan->ppTruths[i+1][2*k+1], pMan->ppTruths[i][k], p->nVars, pCofVars[i] );
        }
    // decompose each cofactor w.r.t. the bound set
    nCofs = (1<<nCofVars);
    for ( k = 0; k < nCofs; k++ )
    {
        pNtkDec = Kit_DsdDecomposeExpand( pMan->ppTruths[nCofVars][k], p->nVars );
        Kit_DsdTruthPartialTwo( pMan->pDsdMan, pNtkDec, uBoundSet, iVacVar, pMan->ppTruths[nCofVars+1][k], pMan->ppTruths[nCofVars+1][nCofs+k] );
        Kit_DsdNtkFree( pNtkDec );
    }
    // compute the composition/decomposition functions (they will be in pMan->ppTruths[1][0]/pMan->ppTruths[1][1])
    for ( i = nCofVars; i >= 1; i-- )
        for ( k = 0; k < (1<<i); k++ )
            Kit_TruthMuxVar( pMan->ppTruths[i][k], pMan->ppTruths[i+1][2*k+0], pMan->ppTruths[i+1][2*k+1], p->nVars, pCofVars[i-1] );

    // derive the new component (decomposition function)
    pNew = Lpk_FunDup( p, pMan->ppTruths[1][1] );
    // update the old component (composition function)
    Kit_TruthCopy( Lpk_FunTruth(p, 0), pMan->ppTruths[1][0], p->nVars );
    p->uSupp = Kit_TruthSupport( Lpk_FunTruth(p, 0), p->nVars );
    p->pFanins[iVacVar] = pNew->Id;
    p->pDelays[iVacVar] = Lpk_SuppDelay( pNew->uSupp, pNew->pDelays );
    // support minimize both
    p->fSupports = 0;
    Lpk_FunSuppMinimize( p );
    Lpk_FunSuppMinimize( pNew );
    // update delay and area requirements
    pNew->nDelayLim = p->pDelays[iVacVar];
    pNew->nAreaLim = 1;
    p->nAreaLim = p->nAreaLim - 1;
    return pNew;
}